

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::CompareWithReference
          (MapRangeReadBitTest *this,GLuint *data,GLintptr offset,GLsizei length)

{
  ulong uVar1;
  long lVar2;
  ostringstream *poVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  if (data == (GLuint *)0x0) {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"glMapNamedBufferRange called with offset ",0x29);
    std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," and length ",0xc);
    std::ostream::operator<<(poVar3,length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3," returned NULL pointer, but buffer\'s data was expected.",0x37);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_128);
  }
  else {
    uVar5 = (ulong)offset >> 2;
    uVar4 = (uint)uVar5;
    uVar6 = (uint)((ulong)(length + offset) >> 2);
    bVar8 = uVar4 < uVar6;
    if (bVar8) {
      if (*data == *(GLuint *)(s_reference + (uVar5 & 0xffffffff) * 4)) {
        uVar7 = 0;
        do {
          if ((1 - uVar6) + uVar4 + (int)uVar7 == 0) {
            return true;
          }
          uVar1 = uVar7 + 1;
          lVar2 = uVar7 * 4;
          uVar7 = uVar1;
        } while (data[uVar1 & 0xffffffff] ==
                 *(GLuint *)((uVar5 & 0xffffffff) * 4 + 0x1b05dc4 + lVar2));
        bVar8 = uVar4 + (int)uVar1 < uVar6;
      }
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar3 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"glMapNamedBufferRange called with offset ",0x29);
      std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," and length ",0xc);
      std::ostream::operator<<(poVar3,length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,
                 " returned pointer to data which is not identical to reference data.",0x43);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_128);
      if (bVar8) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool MapRangeReadBitTest::CompareWithReference(glw::GLuint* data, glw::GLintptr offset, glw::GLsizei length)
{
	if (DE_NULL == data)
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
			<< length << " returned NULL pointer, but buffer's data was expected." << tcu::TestLog::EndMessage;
	}
	else
	{
		glw::GLuint start = static_cast<glw::GLuint>((offset) / sizeof(s_reference[0]));
		glw::GLuint end   = static_cast<glw::GLuint>((offset + length) / sizeof(s_reference[0]));

		/* Comparison results with reference data. */
		for (glw::GLuint i = start; i < end; ++i)
		{
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
			if (data[i - start] != s_reference[i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
					<< length << " returned pointer to data which is not identical to reference data."
					<< tcu::TestLog::EndMessage;

				return false;
			}
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic pop
#endif
		}
	}

	return true;
}